

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderQuads.cpp
# Opt level: O2

int __thiscall
glcts::TessellationShaderQuadsTests::init(TessellationShaderQuadsTests *this,EVP_PKEY_CTX *ctx)

{
  ExtParameters *extParams;
  int extraout_EAX;
  TessellationShaderQuadsDegenerateCase *this_00;
  TessellationShaderQuadsInnerTessellationLevelRounding *this_01;
  
  this_00 = (TessellationShaderQuadsDegenerateCase *)operator_new(0x2d8);
  extParams = &(this->super_TestCaseGroupBase).m_extParams;
  TessellationShaderQuadsDegenerateCase::TessellationShaderQuadsDegenerateCase
            (this_00,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  this_01 = (TessellationShaderQuadsInnerTessellationLevelRounding *)operator_new(0x2d8);
  TessellationShaderQuadsInnerTessellationLevelRounding::
  TessellationShaderQuadsInnerTessellationLevelRounding
            (this_01,(this->super_TestCaseGroupBase).m_context,extParams);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  return extraout_EAX;
}

Assistant:

void TessellationShaderQuadsTests::init(void)
{
	addChild(new glcts::TessellationShaderQuadsDegenerateCase(m_context, m_extParams));
	addChild(new glcts::TessellationShaderQuadsInnerTessellationLevelRounding(m_context, m_extParams));
}